

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O1

bool __thiscall Trie::loadDict(Trie *this,char *filePath)

{
  pointer *ppuVar1;
  iterator __position;
  iterator __position_00;
  uint uVar2;
  istream *piVar3;
  uint32_t w;
  string line;
  Unicode _unicode;
  ifstream ifs;
  uchar local_289;
  uint local_288;
  uint local_284;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_280;
  char *local_278;
  undefined8 local_270;
  char local_268 [16];
  Unicode local_258;
  long local_238 [4];
  uint auStack_218 [122];
  
  std::ifstream::ifstream(local_238,filePath,_S_in);
  local_288 = *(uint *)((long)auStack_218 + *(long *)(local_238[0] + -0x18));
  if ((local_288 & 5) == 0) {
    local_278 = local_268;
    local_270 = 0;
    local_268[0] = '\0';
    local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_280 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->weightVect;
    while ((*(byte *)((long)auStack_218 + *(long *)(local_238[0] + -0x18)) & 2) == 0) {
      piVar3 = std::operator>>((istream *)local_238,(string *)&local_278);
      std::istream::_M_extract<unsigned_int>((uint *)piVar3);
      Limonp::utf8ToUnicode(local_278,(uint)local_270,&local_258);
      __position._M_current =
           (this->weightVect).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->weightVect).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_280,__position,&local_284);
      }
      else {
        *__position._M_current = local_284;
        (this->weightVect).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      local_289 = (uchar)((uint)((int)local_258.
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (int)local_258.
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 1);
      __position_00._M_current =
           (this->lengthVect).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->lengthVect).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (&this->lengthVect,__position_00,&local_289);
      }
      else {
        *__position_00._M_current = local_289;
        ppuVar1 = &(this->lengthVect).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      insert(this,&local_258);
      std::istream::ignore((long)local_238,0x40);
    }
    std::ifstream::close();
    if (local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_278 != local_268) {
      operator_delete(local_278);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"faild to load Dict file",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  uVar2 = local_288 & 5;
  std::ifstream::~ifstream(local_238);
  return uVar2 == 0;
}

Assistant:

bool Trie::loadDict(const char *filePath)
{
	ifstream ifs(filePath);
	if ( ! ifs ) {
		cout << "faild to load Dict file" << endl;
		return false;
	}
	string line;
	uint32_t w;
    Unicode _unicode;
	while ( !ifs.eof()) {
		ifs >> line >> w;
	    decode(line, _unicode);
        weightVect.push_back(w);
		lengthVect.push_back(_unicode.size());
		insert(_unicode);
		ifs.ignore(64, '\n');
	}
	ifs.close();
	return true;
}